

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall re2::DFA::FastSearchLoop(DFA *this,SearchParams *params)

{
  undefined1 uVar1;
  ulong uVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  uVar2 = (ulong)(((uint)params->run_forward |
                  (uint)params->want_earliest_match * 2 + (~params->firstbyte >> 0x1f) * -4) << 4);
  UNRECOVERED_JUMPTABLE = *(code **)((long)FastSearchLoop::Searches + uVar2);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(UNRECOVERED_JUMPTABLE +
                   *(long *)((long)&this->prog_ +
                            *(long *)((long)FastSearchLoop::Searches + uVar2 + 8)) + -1);
  }
  uVar1 = (*UNRECOVERED_JUMPTABLE)();
  return (bool)uVar1;
}

Assistant:

bool DFA::FastSearchLoop(SearchParams* params) {
  // Because the methods are private, the Searches array
  // cannot be declared at top level.
  static bool (DFA::*Searches[])(SearchParams*) = {
    &DFA::SearchFFF,
    &DFA::SearchFFT,
    &DFA::SearchFTF,
    &DFA::SearchFTT,
    &DFA::SearchTFF,
    &DFA::SearchTFT,
    &DFA::SearchTTF,
    &DFA::SearchTTT,
  };

  bool have_firstbyte = (params->firstbyte >= 0);
  int index = 4 * have_firstbyte +
              2 * params->want_earliest_match +
              1 * params->run_forward;
  return (this->*Searches[index])(params);
}